

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O3

Vec_Str_t * Wlc_ConvertToRadix(uint *pBits,int Start,int nBits,int Radix)

{
  Vec_Str_t *pVVar1;
  char *pRes;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  char cVar10;
  uint uVar11;
  char **local_68;
  int *local_60;
  
  pVVar1 = (Vec_Str_t *)malloc(0x10);
  uVar11 = 0x10;
  if (0xe < nBits - 1U) {
    uVar11 = nBits;
  }
  pVVar1->nCap = uVar11;
  if (uVar11 == 0) {
    pVVar1->pArray = (char *)0x0;
    pVVar1->nSize = nBits;
    pRes = (char *)0x0;
    memset((void *)0x0,0,(long)nBits);
    pcVar2 = (char *)0x0;
  }
  else {
    pRes = (char *)malloc((long)(int)uVar11);
    pVVar1->pArray = pRes;
    pVVar1->nSize = nBits;
    memset(pRes,0,(long)nBits);
    pcVar2 = (char *)malloc((long)(int)uVar11);
  }
  local_60 = &pVVar1->nSize;
  local_68 = &pVVar1->pArray;
  memset(pcVar2,0,(long)nBits);
  if (0x21 < Radix - 2U) {
    __assert_fail("Radix >= 2 && Radix < 36",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                  ,0x44,"Vec_Str_t *Wlc_ConvertToRadix(unsigned int *, int, int, int)");
  }
  *pcVar2 = '\x01';
  if (0 < nBits) {
    iVar6 = 0;
    do {
      if ((pBits[Start + iVar6 >> 5] >> (Start + iVar6 & 0x1fU) & 1) != 0) {
        Wlc_ComputeSum(pRes,pcVar2,nBits,Radix);
      }
      if (iVar6 < (int)(nBits - 1U)) {
        Wlc_ComputeSum(pcVar2,pcVar2,nBits,Radix);
      }
      iVar6 = iVar6 + 1;
    } while (nBits != iVar6);
  }
  free(pcVar2);
  uVar4 = (ulong)(uint)nBits;
  uVar7 = nBits >> 0x1f & nBits;
  lVar3 = uVar4 << 0x20;
  lVar8 = -1;
  lVar5 = 0;
  do {
    iVar6 = (int)lVar5;
    if (nBits + iVar6 < 1) goto LAB_001ca5ce;
    lVar3 = lVar3 + -0x100000000;
    lVar8 = lVar8 + 1;
    lVar5 = lVar5 + -1;
  } while (pRes[(nBits + iVar6) - 1] == '\0');
  uVar7 = (uint)(uVar4 - lVar8);
  if (nBits < (int)uVar7) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
  }
  *local_60 = uVar7;
  uVar9 = lVar5 + uVar4 & 0xffffffff;
  iVar6 = nBits - (int)lVar8;
  do {
    cVar10 = '0';
    if ('\t' < pRes[uVar9]) {
      cVar10 = 'W';
    }
    pRes[uVar9] = cVar10 + pRes[uVar9];
    uVar9 = uVar9 - 1;
    iVar6 = iVar6 + -1;
  } while (0 < iVar6);
  if (lVar5 + uVar4 != 0) {
    uVar9 = 0;
    do {
      cVar10 = pRes[uVar9];
      pRes[uVar9] = pRes[lVar3 >> 0x20];
      pRes[lVar3 >> 0x20] = cVar10;
      uVar9 = uVar9 + 1;
      lVar3 = lVar3 + -0x100000000;
    } while (((uint)(uVar4 - lVar8 >> 1) & 0x3fffffff) != uVar9);
  }
LAB_001ca5ce:
  if (uVar7 == 0) {
    if (uVar11 == 0) {
      if (pRes == (char *)0x0) {
        pRes = (char *)malloc(0x10);
      }
      else {
        pRes = (char *)realloc(pRes,0x10);
      }
      pVVar1->pArray = pRes;
      pVVar1->nCap = 0x10;
    }
    pVVar1->nSize = 1;
    *pRes = '0';
    uVar11 = pVVar1->nCap;
    uVar7 = pVVar1->nSize;
  }
  if (uVar7 == uVar11) {
    if ((int)uVar11 < 0x10) {
      if (*local_68 == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(*local_68,0x10);
      }
      pVVar1->pArray = pcVar2;
      pVVar1->nCap = 0x10;
    }
    else {
      uVar11 = uVar11 * 2;
      if (*local_68 == (char *)0x0) {
        pcVar2 = (char *)malloc((ulong)uVar11);
      }
      else {
        pcVar2 = (char *)realloc(*local_68,(ulong)uVar11);
      }
      pVVar1->pArray = pcVar2;
      pVVar1->nCap = uVar11;
    }
  }
  else {
    pcVar2 = *local_68;
  }
  pVVar1->nSize = uVar7 + 1;
  pcVar2[(int)uVar7] = '\0';
  return pVVar1;
}

Assistant:

Vec_Str_t * Wlc_ConvertToRadix( unsigned * pBits, int Start, int nBits, int Radix )
{
    Vec_Str_t * vRes = Vec_StrStart( nBits );
    Vec_Str_t * vSum = Vec_StrStart( nBits );
    char * pRes = Vec_StrArray( vRes );
    char * pSum = Vec_StrArray( vSum );  int i;
    assert( Radix >= 2 && Radix < 36 );
    pSum[0] = 1;
    // compute number
    for ( i = 0; i < nBits; i++ )
    {
        if ( Abc_InfoHasBit(pBits, Start + i) )
            Wlc_ComputeSum( pRes, pSum, nBits, Radix );
        if ( i < nBits - 1 )
            Wlc_ComputeSum( pSum, pSum, nBits, Radix );
    }
    Vec_StrFree( vSum );
    // remove zeros
    for ( i = nBits - 1; i >= 0; i-- )
        if ( pRes[i] )
            break;
    Vec_StrShrink( vRes, i+1 );
    // convert to chars
    for ( ; i >= 0; i-- )
    {
        if ( pRes[i] < 10 )
            pRes[i] += '0';
        else
            pRes[i] += 'a' - 10;
    }
    Vec_StrReverseOrder( vRes );
    if ( Vec_StrSize(vRes) == 0 )
        Vec_StrPush( vRes, '0' );
    Vec_StrPush( vRes, '\0' );
    return vRes;
}